

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidget::collapseItem(QTreeWidget *this,QTreeWidgetItem *item)

{
  long lVar1;
  char *__s;
  undefined1 uVar2;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_30;
  
  local_30 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  lVar1 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  if (lVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined1 *)(lVar1 + 0x54);
    *(undefined1 *)(lVar1 + 0x54) = 1;
  }
  __s = (char *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  QTreeModel::index((QTreeModel *)&stack0xffffffffffffffb8,__s,(int)item);
  QTreeView::collapse(&this->super_QTreeView,(QModelIndex *)&stack0xffffffffffffffb8);
  if (lVar1 != 0) {
    *(undefined1 *)(lVar1 + 0x54) = uVar2;
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidget::collapseItem(const QTreeWidgetItem *item)
{
    Q_D(QTreeWidget);
    QTreeModel::SkipSorting skipSorting(d->treeModel());
    collapse(d->index(item));
}